

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void calcNodesMatricesRecursive(cgltf_node *node,mat4 *parentMat)

{
  mat4 *parentMat_00;
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined4 uVar90;
  undefined4 uVar91;
  undefined4 uVar92;
  undefined4 uVar93;
  undefined4 uVar94;
  undefined4 uVar95;
  undefined4 uVar96;
  undefined4 uVar97;
  cgltf_size cVar98;
  cgltf_node **ppcVar99;
  cgltf_node *node_00;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined8 uVar108;
  undefined8 uVar109;
  undefined8 uVar110;
  undefined8 uVar111;
  undefined8 uVar112;
  undefined8 uVar113;
  undefined8 uVar114;
  ulong uVar115;
  long lVar116;
  cgltf_float *pcVar117;
  char *__function;
  undefined8 *puVar118;
  long lVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c8;
  float fStack_c4;
  float local_a8;
  float fStack_a4;
  qua<float,_(glm::qualifier)0> local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  lVar119 = anims::nodesMatrices;
  uVar115 = (ulong)((int)((ulong)((long)node - (long)parsedData->nodes) >> 3) * 0x684bda13);
  if (anims::playingInd == 0) {
    puVar118 = (undefined8 *)0x0;
  }
  else {
    if (DAT_003e8928 <= uVar115) {
      __function = "T &tl::Vector<anims::NodeData>::operator[](size_t) [T = anims::NodeData]";
      goto LAB_00114097;
    }
    puVar118 = (undefined8 *)(uVar115 * 0x18 + anims::nodesData);
  }
  if (DAT_003e8940 <= uVar115) {
    __function = 
    "T &tl::Vector<glm::mat<4, 4, float>>::operator[](size_t) [T = glm::mat<4, 4, float>]";
LAB_00114097:
    __assert_fail("i < _size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/containers/vector.hpp"
                  ,0x2c,__function);
  }
  lVar116 = uVar115 * 0x40;
  parentMat_00 = (mat4 *)(anims::nodesMatrices + lVar116);
  uVar108 = *(undefined8 *)parentMat->value;
  uVar109 = *(undefined8 *)&parentMat->value[0].field_2;
  uVar110 = *(undefined8 *)(parentMat->value + 1);
  uVar111 = *(undefined8 *)&parentMat->value[1].field_2;
  uVar112 = *(undefined8 *)(parentMat->value + 2);
  uVar113 = *(undefined8 *)&parentMat->value[2].field_2;
  uVar114 = *(undefined8 *)&parentMat->value[3].field_2;
  puVar1 = (undefined8 *)(anims::nodesMatrices + 0x30 + lVar116);
  *puVar1 = *(undefined8 *)(parentMat->value + 3);
  puVar1[1] = uVar114;
  puVar1 = (undefined8 *)(lVar119 + 0x20 + lVar116);
  *puVar1 = uVar112;
  puVar1[1] = uVar113;
  puVar1 = (undefined8 *)(lVar119 + 0x10 + lVar116);
  *puVar1 = uVar110;
  puVar1[1] = uVar111;
  *(undefined8 *)(lVar119 + lVar116) = uVar108;
  ((undefined8 *)(lVar119 + lVar116))[1] = uVar109;
  if (node->has_matrix != 0) {
    fVar120 = node->matrix[0];
    fVar123 = node->matrix[1];
    fVar121 = node->matrix[2];
    fVar122 = node->matrix[3];
    fVar124 = node->matrix[4];
    fVar125 = node->matrix[5];
    fVar126 = node->matrix[6];
    fVar127 = node->matrix[7];
    fVar100 = node->matrix[8];
    uVar2 = parentMat_00->value[0].field_0;
    uVar50 = parentMat_00->value[0].field_1;
    uVar3 = parentMat_00->value[0].field_2;
    uVar51 = parentMat_00->value[0].field_3;
    uVar4 = parentMat_00->value[1].field_0;
    uVar52 = parentMat_00->value[1].field_1;
    uVar5 = parentMat_00->value[2].field_0;
    uVar53 = parentMat_00->value[2].field_1;
    uVar6 = parentMat_00->value[3].field_0;
    uVar54 = parentMat_00->value[3].field_1;
    uVar7 = parentMat_00->value[1].field_2;
    uVar55 = parentMat_00->value[1].field_3;
    uVar8 = parentMat_00->value[2].field_2;
    uVar56 = parentMat_00->value[2].field_3;
    uVar9 = parentMat_00->value[3].field_2;
    uVar57 = parentMat_00->value[3].field_3;
    fVar101 = node->matrix[9];
    fVar102 = node->matrix[10];
    fVar103 = node->matrix[0xb];
    fVar104 = node->matrix[0xc];
    fVar105 = node->matrix[0xd];
    fVar106 = node->matrix[0xe];
    fVar107 = node->matrix[0xf];
    parentMat_00->value[0].field_0.x =
         fVar122 * (float)uVar6 +
         fVar121 * (float)uVar5 + fVar123 * (float)uVar4 + fVar120 * (float)uVar2;
    parentMat_00->value[0].field_1.y =
         fVar122 * (float)uVar54 +
         fVar121 * (float)uVar53 + fVar123 * (float)uVar52 + fVar120 * (float)uVar50;
    parentMat_00->value[0].field_2.z =
         fVar122 * (float)uVar9 +
         fVar121 * (float)uVar8 + fVar123 * (float)uVar7 + fVar120 * (float)uVar3;
    parentMat_00->value[0].field_3.w =
         fVar122 * (float)uVar57 +
         fVar121 * (float)uVar56 + fVar123 * (float)uVar55 + fVar120 * (float)uVar51;
    parentMat_00->value[1].field_0.x =
         fVar127 * (float)uVar6 +
         fVar126 * (float)uVar5 + fVar125 * (float)uVar4 + fVar124 * (float)uVar2;
    parentMat_00->value[1].field_1.y =
         fVar127 * (float)uVar54 +
         fVar126 * (float)uVar53 + fVar125 * (float)uVar52 + fVar124 * (float)uVar50;
    parentMat_00->value[1].field_2.z =
         fVar127 * (float)uVar9 +
         fVar126 * (float)uVar8 + fVar125 * (float)uVar7 + fVar124 * (float)uVar3;
    parentMat_00->value[1].field_3.w =
         fVar127 * (float)uVar57 +
         fVar126 * (float)uVar56 + fVar125 * (float)uVar55 + fVar124 * (float)uVar51;
    parentMat_00->value[2].field_0.x =
         fVar103 * (float)uVar6 +
         fVar102 * (float)uVar5 + fVar101 * (float)uVar4 + fVar100 * (float)uVar2;
    parentMat_00->value[2].field_1.y =
         fVar103 * (float)uVar54 +
         fVar102 * (float)uVar53 + fVar101 * (float)uVar52 + fVar100 * (float)uVar50;
    parentMat_00->value[2].field_2.z =
         fVar103 * (float)uVar9 +
         fVar102 * (float)uVar8 + fVar101 * (float)uVar7 + fVar100 * (float)uVar3;
    parentMat_00->value[2].field_3.w =
         fVar103 * (float)uVar57 +
         fVar102 * (float)uVar56 + fVar101 * (float)uVar55 + fVar100 * (float)uVar51;
    parentMat_00->value[3].field_0.x =
         (float)uVar6 * fVar107 +
         (float)uVar5 * fVar106 + (float)uVar4 * fVar105 + (float)uVar2 * fVar104;
    parentMat_00->value[3].field_1.y =
         (float)uVar54 * fVar107 +
         (float)uVar53 * fVar106 + (float)uVar52 * fVar105 + (float)uVar50 * fVar104;
    parentMat_00->value[3].field_2.z =
         fVar107 * (float)uVar9 +
         fVar106 * (float)uVar8 + fVar105 * (float)uVar7 + fVar104 * (float)uVar3;
    parentMat_00->value[3].field_3.w =
         fVar107 * (float)uVar57 +
         fVar106 * (float)uVar56 + fVar105 * (float)uVar55 + fVar104 * (float)uVar51;
  }
  if ((puVar118 == (undefined8 *)0x0) ||
     (puVar1 = (undefined8 *)*puVar118, puVar1 == (undefined8 *)0x0)) {
    if (node->has_translation != 0) {
      fVar120 = (float)*(undefined8 *)node->translation;
      fVar123 = (float)((ulong)*(undefined8 *)node->translation >> 0x20);
      fVar121 = fVar120 * 0.0;
      fVar122 = fVar123 * 0.0;
      fVar125 = fVar122 + fVar121;
      fVar124 = node->translation[2] * 0.0;
      fVar126 = fVar120 + fVar122 + fVar124 + 0.0;
      fVar121 = fVar123 + fVar121 + fVar124 + 0.0;
      fVar122 = fVar124 + fVar125 + 1.0;
      fVar124 = node->translation[2] + fVar125 + 0.0;
      uVar18 = parentMat_00->value[0].field_0;
      uVar66 = parentMat_00->value[0].field_1;
      uVar19 = parentMat_00->value[0].field_2;
      uVar67 = parentMat_00->value[0].field_3;
      uVar20 = parentMat_00->value[1].field_0;
      uVar68 = parentMat_00->value[1].field_1;
      uVar21 = parentMat_00->value[1].field_2;
      uVar69 = parentMat_00->value[1].field_3;
      uVar22 = parentMat_00->value[2].field_0;
      uVar70 = parentMat_00->value[2].field_1;
      uVar23 = parentMat_00->value[3].field_0;
      uVar71 = parentMat_00->value[3].field_1;
      fVar125 = (float)uVar23 * 0.0;
      fVar127 = (float)uVar71 * 0.0;
      uVar24 = parentMat_00->value[3].field_2;
      uVar72 = parentMat_00->value[3].field_3;
      fVar120 = (float)uVar24 * 0.0;
      fVar123 = (float)uVar72 * 0.0;
      uVar25 = parentMat_00->value[2].field_2;
      uVar73 = parentMat_00->value[2].field_3;
      parentMat_00->value[0].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
           ((float)uVar18 + (float)uVar20 * 0.0 + (float)uVar22 * 0.0 + fVar125);
      parentMat_00->value[0].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           ((float)uVar66 + (float)uVar68 * 0.0 + (float)uVar70 * 0.0 + fVar127);
      parentMat_00->value[0].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
           ((float)uVar19 + (float)uVar21 * 0.0 + (float)uVar25 * 0.0 + fVar120);
      parentMat_00->value[0].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           ((float)uVar67 + (float)uVar69 * 0.0 + (float)uVar73 * 0.0 + fVar123);
      parentMat_00->value[1].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
           ((float)uVar18 * 0.0 + (float)uVar20 + (float)uVar22 * 0.0 + fVar125);
      parentMat_00->value[1].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           ((float)uVar66 * 0.0 + (float)uVar68 + (float)uVar70 * 0.0 + fVar127);
      parentMat_00->value[1].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
           ((float)uVar19 * 0.0 + (float)uVar21 + (float)uVar25 * 0.0 + fVar120);
      parentMat_00->value[1].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           ((float)uVar67 * 0.0 + (float)uVar69 + (float)uVar73 * 0.0 + fVar123);
      parentMat_00->value[2].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
           ((float)uVar18 * 0.0 + (float)uVar20 * 0.0 + (float)uVar22 + fVar125);
      parentMat_00->value[2].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           ((float)uVar66 * 0.0 + (float)uVar68 * 0.0 + (float)uVar70 + fVar127);
      parentMat_00->value[2].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
           ((float)uVar19 * 0.0 + (float)uVar21 * 0.0 + (float)uVar25 + fVar120);
      parentMat_00->value[2].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           ((float)uVar67 * 0.0 + (float)uVar69 * 0.0 + (float)uVar73 + fVar123);
      parentMat_00->value[3].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
           ((float)uVar23 * fVar122 +
           (float)uVar22 * fVar124 + (float)uVar20 * fVar121 + (float)uVar18 * fVar126);
      parentMat_00->value[3].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           ((float)uVar71 * fVar122 +
           (float)uVar70 * fVar124 + (float)uVar68 * fVar121 + (float)uVar66 * fVar126);
      parentMat_00->value[3].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
           (fVar122 * (float)uVar24 +
           fVar124 * (float)uVar25 + fVar121 * (float)uVar21 + fVar126 * (float)uVar19);
      parentMat_00->value[3].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           (fVar122 * (float)uVar72 +
           fVar124 * (float)uVar73 + fVar121 * (float)uVar69 + fVar126 * (float)uVar67);
    }
    if (puVar118 != (undefined8 *)0x0) goto LAB_001139cb;
LAB_00113bf4:
    if (node->has_rotation != 0) {
      local_78.x = node->rotation[0];
      local_78.y = node->rotation[1];
      local_78.z = node->rotation[2];
      local_78.w = node->rotation[3];
      glm::toMat4<float,(glm::qualifier)0>(&local_78);
      uVar34 = parentMat_00->value[0].field_0;
      uVar82 = parentMat_00->value[0].field_1;
      uVar35 = parentMat_00->value[0].field_2;
      uVar83 = parentMat_00->value[0].field_3;
      uVar36 = parentMat_00->value[1].field_0;
      uVar84 = parentMat_00->value[1].field_1;
      uVar37 = parentMat_00->value[1].field_2;
      uVar85 = parentMat_00->value[1].field_3;
      uVar38 = parentMat_00->value[2].field_0;
      uVar86 = parentMat_00->value[2].field_1;
      uVar39 = parentMat_00->value[2].field_2;
      uVar87 = parentMat_00->value[2].field_3;
      uVar40 = parentMat_00->value[3].field_0;
      uVar88 = parentMat_00->value[3].field_1;
      uVar41 = parentMat_00->value[3].field_2;
      uVar89 = parentMat_00->value[3].field_3;
      parentMat_00->value[0].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
           ((float)uVar40 * fStack_5c +
           (float)uVar38 * fStack_60 + (float)uVar36 * fStack_64 + (float)uVar34 * local_68);
      parentMat_00->value[0].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           ((float)uVar88 * fStack_5c +
           (float)uVar86 * fStack_60 + (float)uVar84 * fStack_64 + (float)uVar82 * local_68);
      parentMat_00->value[0].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
           (fStack_5c * (float)uVar41 +
           fStack_60 * (float)uVar39 + fStack_64 * (float)uVar37 + local_68 * (float)uVar35);
      parentMat_00->value[0].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           (fStack_5c * (float)uVar89 +
           fStack_60 * (float)uVar87 + fStack_64 * (float)uVar85 + local_68 * (float)uVar83);
      parentMat_00->value[1].field_0.x =
           (float)uVar40 * fStack_4c +
           (float)uVar38 * fStack_50 + (float)uVar36 * fStack_54 + (float)uVar34 * local_58;
      parentMat_00->value[1].field_1.y =
           (float)uVar88 * fStack_4c +
           (float)uVar86 * fStack_50 + (float)uVar84 * fStack_54 + (float)uVar82 * local_58;
      parentMat_00->value[1].field_2.z =
           fStack_4c * (float)uVar41 +
           fStack_50 * (float)uVar39 + fStack_54 * (float)uVar37 + local_58 * (float)uVar35;
      parentMat_00->value[1].field_3.w =
           fStack_4c * (float)uVar89 +
           fStack_50 * (float)uVar87 + fStack_54 * (float)uVar85 + local_58 * (float)uVar83;
      parentMat_00->value[2].field_0.x =
           (float)uVar40 * fStack_3c +
           (float)uVar38 * fStack_40 + (float)uVar36 * fStack_44 + (float)uVar34 * local_48;
      parentMat_00->value[2].field_1.y =
           (float)uVar88 * fStack_3c +
           (float)uVar86 * fStack_40 + (float)uVar84 * fStack_44 + (float)uVar82 * local_48;
      parentMat_00->value[2].field_2.z =
           fStack_3c * (float)uVar41 +
           fStack_40 * (float)uVar39 + fStack_44 * (float)uVar37 + local_48 * (float)uVar35;
      parentMat_00->value[2].field_3.w =
           fStack_3c * (float)uVar89 +
           fStack_40 * (float)uVar87 + fStack_44 * (float)uVar85 + local_48 * (float)uVar83;
      parentMat_00->value[3].field_0.x =
           (float)uVar40 * fStack_2c +
           (float)uVar38 * fStack_30 + (float)uVar36 * fStack_34 + (float)uVar34 * local_38;
      parentMat_00->value[3].field_1.y =
           (float)uVar88 * fStack_2c +
           (float)uVar86 * fStack_30 + (float)uVar84 * fStack_34 + (float)uVar82 * local_38;
      parentMat_00->value[3].field_2.z =
           fStack_2c * (float)uVar41 +
           fStack_30 * (float)uVar39 + fStack_34 * (float)uVar37 + local_38 * (float)uVar35;
      parentMat_00->value[3].field_3.w =
           fStack_2c * (float)uVar89 +
           fStack_30 * (float)uVar87 + fStack_34 * (float)uVar85 + local_38 * (float)uVar83;
    }
    if (puVar118 != (undefined8 *)0x0) goto LAB_00113e25;
LAB_00113e39:
    if (node->has_scale == 0) goto LAB_0011400f;
    pcVar117 = node->scale;
  }
  else {
    fVar120 = (float)*puVar1;
    fVar123 = (float)((ulong)*puVar1 >> 0x20);
    fVar121 = fVar120 * 0.0;
    fVar122 = fVar123 * 0.0;
    fVar125 = fVar122 + fVar121;
    fVar124 = *(float *)(puVar1 + 1) * 0.0;
    fVar126 = fVar120 + fVar122 + fVar124 + 0.0;
    fVar120 = fVar123 + fVar121 + fVar124 + 0.0;
    fVar122 = fVar124 + fVar125 + 1.0;
    fVar124 = *(float *)(puVar1 + 1) + fVar125 + 0.0;
    uVar10 = parentMat_00->value[0].field_0;
    uVar58 = parentMat_00->value[0].field_1;
    uVar11 = parentMat_00->value[0].field_2;
    uVar59 = parentMat_00->value[0].field_3;
    uVar12 = parentMat_00->value[1].field_0;
    uVar60 = parentMat_00->value[1].field_1;
    uVar13 = parentMat_00->value[1].field_2;
    uVar61 = parentMat_00->value[1].field_3;
    uVar14 = parentMat_00->value[2].field_0;
    uVar62 = parentMat_00->value[2].field_1;
    uVar15 = parentMat_00->value[3].field_0;
    uVar63 = parentMat_00->value[3].field_1;
    fVar125 = (float)uVar15 * 0.0;
    fVar127 = (float)uVar63 * 0.0;
    uVar16 = parentMat_00->value[3].field_2;
    uVar64 = parentMat_00->value[3].field_3;
    fVar123 = (float)uVar16 * 0.0;
    fVar121 = (float)uVar64 * 0.0;
    uVar17 = parentMat_00->value[2].field_2;
    uVar65 = parentMat_00->value[2].field_3;
    parentMat_00->value[0].field_0 =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
         ((float)uVar10 + (float)uVar12 * 0.0 + (float)uVar14 * 0.0 + fVar125);
    parentMat_00->value[0].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
         ((float)uVar58 + (float)uVar60 * 0.0 + (float)uVar62 * 0.0 + fVar127);
    parentMat_00->value[0].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
         ((float)uVar11 + (float)uVar13 * 0.0 + (float)uVar17 * 0.0 + fVar123);
    parentMat_00->value[0].field_3 =
         (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
         ((float)uVar59 + (float)uVar61 * 0.0 + (float)uVar65 * 0.0 + fVar121);
    parentMat_00->value[1].field_0 =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
         ((float)uVar10 * 0.0 + (float)uVar12 + (float)uVar14 * 0.0 + fVar125);
    parentMat_00->value[1].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
         ((float)uVar58 * 0.0 + (float)uVar60 + (float)uVar62 * 0.0 + fVar127);
    parentMat_00->value[1].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
         ((float)uVar11 * 0.0 + (float)uVar13 + (float)uVar17 * 0.0 + fVar123);
    parentMat_00->value[1].field_3 =
         (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
         ((float)uVar59 * 0.0 + (float)uVar61 + (float)uVar65 * 0.0 + fVar121);
    parentMat_00->value[2].field_0 =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
         ((float)uVar10 * 0.0 + (float)uVar12 * 0.0 + (float)uVar14 + fVar125);
    parentMat_00->value[2].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
         ((float)uVar58 * 0.0 + (float)uVar60 * 0.0 + (float)uVar62 + fVar127);
    parentMat_00->value[2].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
         ((float)uVar11 * 0.0 + (float)uVar13 * 0.0 + (float)uVar17 + fVar123);
    parentMat_00->value[2].field_3 =
         (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
         ((float)uVar59 * 0.0 + (float)uVar61 * 0.0 + (float)uVar65 + fVar121);
    parentMat_00->value[3].field_0 =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
         ((float)uVar15 * fVar122 +
         (float)uVar14 * fVar124 + (float)uVar12 * fVar120 + (float)uVar10 * fVar126);
    parentMat_00->value[3].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
         ((float)uVar63 * fVar122 +
         (float)uVar62 * fVar124 + (float)uVar60 * fVar120 + (float)uVar58 * fVar126);
    parentMat_00->value[3].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
         (fVar122 * (float)uVar16 +
         fVar124 * (float)uVar17 + fVar120 * (float)uVar13 + fVar126 * (float)uVar11);
    parentMat_00->value[3].field_3 =
         (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
         (fVar122 * (float)uVar64 +
         fVar124 * (float)uVar65 + fVar120 * (float)uVar61 + fVar126 * (float)uVar59);
LAB_001139cb:
    if ((qua<float,_(glm::qualifier)0> *)puVar118[1] == (qua<float,_(glm::qualifier)0> *)0x0)
    goto LAB_00113bf4;
    glm::toMat4<float,(glm::qualifier)0>((qua<float,_(glm::qualifier)0> *)puVar118[1]);
    uVar26 = parentMat_00->value[0].field_0;
    uVar74 = parentMat_00->value[0].field_1;
    uVar27 = parentMat_00->value[0].field_2;
    uVar75 = parentMat_00->value[0].field_3;
    uVar28 = parentMat_00->value[1].field_0;
    uVar76 = parentMat_00->value[1].field_1;
    uVar29 = parentMat_00->value[1].field_2;
    uVar77 = parentMat_00->value[1].field_3;
    uVar30 = parentMat_00->value[2].field_0;
    uVar78 = parentMat_00->value[2].field_1;
    uVar31 = parentMat_00->value[2].field_2;
    uVar79 = parentMat_00->value[2].field_3;
    uVar32 = parentMat_00->value[3].field_0;
    uVar80 = parentMat_00->value[3].field_1;
    uVar33 = parentMat_00->value[3].field_2;
    uVar81 = parentMat_00->value[3].field_3;
    parentMat_00->value[0].field_0 =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
         ((float)uVar32 * fStack_5c +
         (float)uVar30 * fStack_60 + (float)uVar28 * fStack_64 + (float)uVar26 * local_68);
    parentMat_00->value[0].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
         ((float)uVar80 * fStack_5c +
         (float)uVar78 * fStack_60 + (float)uVar76 * fStack_64 + (float)uVar74 * local_68);
    parentMat_00->value[0].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
         (fStack_5c * (float)uVar33 +
         fStack_60 * (float)uVar31 + fStack_64 * (float)uVar29 + local_68 * (float)uVar27);
    parentMat_00->value[0].field_3 =
         (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
         (fStack_5c * (float)uVar81 +
         fStack_60 * (float)uVar79 + fStack_64 * (float)uVar77 + local_68 * (float)uVar75);
    parentMat_00->value[1].field_0.x =
         (float)uVar32 * fStack_4c +
         (float)uVar30 * fStack_50 + (float)uVar28 * fStack_54 + (float)uVar26 * local_58;
    parentMat_00->value[1].field_1.y =
         (float)uVar80 * fStack_4c +
         (float)uVar78 * fStack_50 + (float)uVar76 * fStack_54 + (float)uVar74 * local_58;
    parentMat_00->value[1].field_2.z =
         fStack_4c * (float)uVar33 +
         fStack_50 * (float)uVar31 + fStack_54 * (float)uVar29 + local_58 * (float)uVar27;
    parentMat_00->value[1].field_3.w =
         fStack_4c * (float)uVar81 +
         fStack_50 * (float)uVar79 + fStack_54 * (float)uVar77 + local_58 * (float)uVar75;
    parentMat_00->value[2].field_0.x =
         (float)uVar32 * fStack_3c +
         (float)uVar30 * fStack_40 + (float)uVar28 * fStack_44 + (float)uVar26 * local_48;
    parentMat_00->value[2].field_1.y =
         (float)uVar80 * fStack_3c +
         (float)uVar78 * fStack_40 + (float)uVar76 * fStack_44 + (float)uVar74 * local_48;
    parentMat_00->value[2].field_2.z =
         fStack_3c * (float)uVar33 +
         fStack_40 * (float)uVar31 + fStack_44 * (float)uVar29 + local_48 * (float)uVar27;
    parentMat_00->value[2].field_3.w =
         fStack_3c * (float)uVar81 +
         fStack_40 * (float)uVar79 + fStack_44 * (float)uVar77 + local_48 * (float)uVar75;
    parentMat_00->value[3].field_0.x =
         (float)uVar32 * fStack_2c +
         (float)uVar30 * fStack_30 + (float)uVar28 * fStack_34 + (float)uVar26 * local_38;
    parentMat_00->value[3].field_1.y =
         (float)uVar80 * fStack_2c +
         (float)uVar78 * fStack_30 + (float)uVar76 * fStack_34 + (float)uVar74 * local_38;
    parentMat_00->value[3].field_2.z =
         fStack_2c * (float)uVar33 +
         fStack_30 * (float)uVar31 + fStack_34 * (float)uVar29 + local_38 * (float)uVar27;
    parentMat_00->value[3].field_3.w =
         fStack_2c * (float)uVar81 +
         fStack_30 * (float)uVar79 + fStack_34 * (float)uVar77 + local_38 * (float)uVar75;
LAB_00113e25:
    pcVar117 = (cgltf_float *)puVar118[2];
    if (pcVar117 == (cgltf_float *)0x0) goto LAB_00113e39;
  }
  fVar120 = pcVar117[1];
  fVar125 = fVar120 * 0.0;
  fVar123 = *pcVar117;
  fVar124 = fVar123 * 0.0;
  fVar121 = pcVar117[2];
  fVar122 = fVar121 * 0.0;
  uVar42 = parentMat_00->value[0].field_0;
  uVar90 = parentMat_00->value[0].field_1;
  uVar43 = parentMat_00->value[0].field_2;
  uVar91 = parentMat_00->value[0].field_3;
  uVar44 = parentMat_00->value[1].field_0;
  uVar92 = parentMat_00->value[1].field_1;
  uVar45 = parentMat_00->value[1].field_2;
  uVar93 = parentMat_00->value[1].field_3;
  uVar46 = parentMat_00->value[2].field_0;
  uVar94 = parentMat_00->value[2].field_1;
  uVar47 = parentMat_00->value[2].field_2;
  uVar95 = parentMat_00->value[2].field_3;
  uVar48 = parentMat_00->value[3].field_0;
  uVar96 = parentMat_00->value[3].field_1;
  uVar49 = parentMat_00->value[3].field_2;
  uVar97 = parentMat_00->value[3].field_3;
  parentMat_00->value[0].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
       (fVar124 * (float)uVar48 +
       fVar124 * (float)uVar46 + fVar124 * (float)uVar44 + fVar123 * (float)uVar42);
  parentMat_00->value[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
       (fVar124 * (float)uVar96 +
       fVar124 * (float)uVar94 + fVar124 * (float)uVar92 + fVar123 * (float)uVar90);
  parentMat_00->value[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
       (fVar124 * (float)uVar49 +
       fVar124 * (float)uVar47 + fVar124 * (float)uVar45 + fVar123 * (float)uVar43);
  parentMat_00->value[0].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
       (fVar124 * (float)uVar97 +
       fVar124 * (float)uVar95 + fVar124 * (float)uVar93 + fVar123 * (float)uVar91);
  parentMat_00->value[1].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
       (fVar125 * (float)uVar48 +
       fVar125 * (float)uVar46 + fVar120 * (float)uVar44 + fVar125 * (float)uVar42);
  parentMat_00->value[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
       (fVar125 * (float)uVar96 +
       fVar125 * (float)uVar94 + fVar120 * (float)uVar92 + fVar125 * (float)uVar90);
  parentMat_00->value[1].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
       (fVar125 * (float)uVar49 +
       fVar125 * (float)uVar47 + fVar120 * (float)uVar45 + fVar125 * (float)uVar43);
  parentMat_00->value[1].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
       (fVar125 * (float)uVar97 +
       fVar125 * (float)uVar95 + fVar120 * (float)uVar93 + fVar125 * (float)uVar91);
  parentMat_00->value[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
       (fVar122 * (float)uVar48 +
       fVar121 * (float)uVar46 + fVar122 * (float)uVar44 + fVar122 * (float)uVar42);
  parentMat_00->value[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
       (fVar122 * (float)uVar96 +
       fVar121 * (float)uVar94 + fVar122 * (float)uVar92 + fVar122 * (float)uVar90);
  parentMat_00->value[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
       (fVar122 * (float)uVar49 +
       fVar121 * (float)uVar47 + fVar122 * (float)uVar45 + fVar122 * (float)uVar43);
  parentMat_00->value[2].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
       (fVar122 * (float)uVar97 +
       fVar121 * (float)uVar95 + fVar122 * (float)uVar93 + fVar122 * (float)uVar91);
  parentMat_00->value[3].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
       ((float)uVar46 * 0.0 + (float)uVar44 * 0.0 + (float)uVar42 * 0.0 + (float)uVar48);
  parentMat_00->value[3].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
       ((float)uVar94 * 0.0 + (float)uVar92 * 0.0 + (float)uVar90 * 0.0 + (float)uVar96);
  parentMat_00->value[3].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
       ((float)uVar47 * 0.0 + (float)uVar45 * 0.0 + (float)uVar43 * 0.0 + (float)uVar49);
  parentMat_00->value[3].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
       ((float)uVar95 * 0.0 + (float)uVar93 * 0.0 + (float)uVar91 * 0.0 + (float)uVar97);
LAB_0011400f:
  cVar98 = node->children_count;
  if (cVar98 != 0) {
    ppcVar99 = node->children;
    lVar119 = 0;
    do {
      node_00 = *(cgltf_node **)((long)ppcVar99 + lVar119);
      if (node_00 == (cgltf_node *)0x0) {
        __assert_fail("child",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                      ,0x251,
                      "void calcNodesMatricesRecursive(const cgltf_node &, const glm::mat4 &)");
      }
      calcNodesMatricesRecursive(node_00,parentMat_00);
      lVar119 = lVar119 + 8;
    } while (cVar98 << 3 != lVar119);
  }
  return;
}

Assistant:

static void calcNodesMatricesRecursive(const cgltf_node& node, const glm::mat4& parentMat = glm::mat4(1.0))
{
    const i32 nodeInd = getNodeInd(&node);
    const auto animData = anims::playingInd ? &anims::nodesData[nodeInd] : nullptr;
    glm::mat4& mtx = anims::nodesMatrices[nodeInd];
    mtx = parentMat;
    if(node.has_matrix)
        mtx *= glm::make_mat4(node.matrix);

    if(animData && animData->position)
        mtx *= glm::translate(glm::mat4(1), *animData->position);
    else if(node.has_translation)
        mtx *= glm::translate(glm::mat4(1), {node.translation[0], node.translation[1], node.translation[2]});

    if(animData && animData->rotation)
        mtx *= glm::toMat4(*animData->rotation);
    else if(node.has_rotation)
        mtx *= glm::toMat4(glm::quat(node.rotation[3], node.rotation[0], node.rotation[1], node.rotation[2]));

    if(animData && animData->scale)
        mtx *= glm::scale(glm::mat4(1), *animData->scale);
    else if(node.has_scale)
        mtx *= glm::scale(glm::mat4(1), vec3(node.scale[0], node.scale[1], node.scale[2]));

    CSpan<cgltf_node*> children(node.children, node.children_count);
    for(cgltf_node* child : children) {
        assert(child);
        calcNodesMatricesRecursive(*child, mtx);
    }
}